

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenStringSliceWTFSetEnd(BinaryenExpressionRef expr,BinaryenExpressionRef endExpr)

{
  if (expr->_id != StringSliceWTFId) {
    __assert_fail("expression->is<StringSliceWTF>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x135c,
                  "void BinaryenStringSliceWTFSetEnd(BinaryenExpressionRef, BinaryenExpressionRef)")
    ;
  }
  if (endExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = endExpr;
    return;
  }
  __assert_fail("endExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x135d,
                "void BinaryenStringSliceWTFSetEnd(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenStringSliceWTFSetEnd(BinaryenExpressionRef expr,
                                  BinaryenExpressionRef endExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StringSliceWTF>());
  assert(endExpr);
  static_cast<StringSliceWTF*>(expression)->end = (Expression*)endExpr;
}